

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void mouse_callback(GLFWwindow *window,double xpos,double ypos)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  if (firstMouse) {
    lastX = (float)xpos;
    lastY = (float)ypos;
    firstMouse = false;
  }
  yaw = (float)(xpos - (double)lastX) * 0.1 + yaw;
  fVar5 = (float)((double)lastY - ypos) * 0.1 + pitch;
  fVar1 = 89.0;
  if (fVar5 <= 89.0) {
    fVar1 = fVar5;
  }
  pitch = -89.0;
  if (-89.0 <= fVar1) {
    pitch = fVar1;
  }
  lastX = (float)xpos;
  lastY = (float)ypos;
  fVar1 = cosf(yaw * 0.017453292);
  fVar5 = cosf(pitch * 0.017453292);
  fVar2 = sinf(pitch * 0.017453292);
  fVar3 = sinf(yaw * 0.017453292);
  fVar4 = cosf(pitch * 0.017453292);
  fVar5 = fVar5 * fVar1;
  fVar4 = fVar4 * fVar3;
  fVar1 = 1.0 / SQRT(fVar4 * fVar4 + fVar2 * fVar2 + fVar5 * fVar5);
  cameraFront.field_0._0_8_ = CONCAT44(fVar1 * fVar2,fVar1 * fVar5);
  cameraFront.field_0.field_0.z = fVar4 * fVar1;
  return;
}

Assistant:

void mouse_callback(GLFWwindow* window, double xpos, double ypos)
{
  if (firstMouse){
    lastX = xpos;
    lastY = ypos;
    firstMouse = false;
  }

  float xoffset = xpos - lastX;
  float yoffset = lastY - ypos; // reversed since y-coordinates go from bottom to top
  lastX = xpos;
  lastY = ypos;

  float sensitivity = 0.1f; // change this value to your liking
  xoffset *= sensitivity;
  yoffset *= sensitivity;

  yaw += xoffset;
  pitch += yoffset;

  // make sure that when pitch is out of bounds, screen doesn't get flipped
  if (pitch > 89.0f)
    pitch = 89.0f;
  if (pitch < -89.0f)
    pitch = -89.0f;

  glm::vec3 front;
  front.x = cos(glm::radians(yaw)) * cos(glm::radians(pitch));
  front.y = sin(glm::radians(pitch));
  front.z = sin(glm::radians(yaw)) * cos(glm::radians(pitch));
  cameraFront = glm::normalize(front);
}